

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O3

int fy_check_document_version(fy_parser *fyp)

{
  uint uVar1;
  int iVar2;
  
  iVar2 = -1;
  if ((fyp->current_document_state->version).major == 1) {
    uVar1 = (fyp->current_document_state->version).minor;
    iVar2 = 0;
    if ((uVar1 != 1) && (iVar2 = -1, (uVar1 & 0xfffffffe) == 2)) {
      iVar2 = 0;
      fy_parser_diag(fyp,0x20,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                     ,0x13d,"fy_check_document_version","Experimental support for version %d.%d",1,
                     (ulong)uVar1);
    }
  }
  return iVar2;
}

Assistant:

int fy_check_document_version(struct fy_parser *fyp) {
    int major, minor;

    major = fyp->current_document_state->version.major;
    minor = fyp->current_document_state->version.minor;

    /* we only support YAML version 1.x */
    if (major == 1) {
        /* 1.1 is supported without warnings */
        if (minor == 1)
            goto ok;

        if (minor == 2 || minor == 3)
            goto experimental;
    }

    return -1;

    experimental:
    fyp_scan_debug(fyp, "Experimental support for version %d.%d",
                   major, minor);
    ok:
    return 0;
}